

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall NoiseShape::NoiseShape(NoiseShape *this,double *coeff,int taps)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  int local_20;
  int i;
  int taps_local;
  double *coeff_local;
  NoiseShape *this_local;
  
  this->mCoeff = coeff;
  this->mTaps = taps;
  this->mErrPtr = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)taps;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  this->mErr = pdVar3;
  for (local_20 = 0; local_20 < taps; local_20 = local_20 + 1) {
    this->mErr[local_20] = 0.0;
  }
  return;
}

Assistant:

NoiseShape(const double *coeff, int taps) {
		mCoeff = coeff;
		mTaps = taps;
		mErrPtr = 0;
		mErr = new double[taps];
		for (int i=0; i<taps; ++i) {
			mErr[i] = .0;
		}
	}